

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O1

void canvas_declare(_glist *x,t_symbol *s,int argc,t_atom *argv)

{
  int iVar1;
  _canvasenvironment *p_Var2;
  t_symbol *ptVar3;
  t_namelist *ptVar4;
  _glist *x_00;
  char *dir;
  _glist *canvas;
  int iVar5;
  char *pcVar6;
  char pathbuf [1000];
  char local_808 [999];
  undefined1 local_421;
  char local_418 [999];
  undefined1 local_31;
  int which;
  
  x_00 = (_glist *)argv;
  p_Var2 = canvas_getenv(x);
  if (argc < 1) {
    return;
  }
  iVar5 = 0;
LAB_001398f8:
  ptVar3 = atom_getsymbolarg(iVar5,argc,argv);
  pcVar6 = ptVar3->s_name;
  which = iVar5 + 1;
  if (which < argc) {
    ptVar3 = atom_getsymbolarg(which,argc,argv);
    dir = ptVar3->s_name;
  }
  else {
    dir = (char *)0x0;
  }
  if (dir == (char *)0x0) {
LAB_00139984:
    post("declare: %s: unknown declaration",pcVar6);
    which = iVar5;
    goto LAB_00139d07;
  }
  iVar1 = strcmp(pcVar6,"-path");
  if (iVar1 == 0) {
    iVar5 = sys_isabsolutepath(dir);
    if (((iVar5 == 0) && (iVar5 = strncmp("./",dir,2), iVar5 != 0)) &&
       (iVar5 = strncmp("../",dir,3), iVar5 != 0)) {
      canvas_completepath(dir,local_418,(int)x,x_00);
      sys_bashfilename(local_418,local_808);
      iVar5 = access(local_808,0);
      if (iVar5 != 0) {
        ptVar4 = (t_namelist *)&(pd_maininstance.pd_stuff)->st_searchpath;
        do {
          ptVar4 = ptVar4->nl_next;
          if (ptVar4 == (t_namelist *)0x0) {
            ptVar4 = (t_namelist *)&(pd_maininstance.pd_stuff)->st_staticpath;
            goto LAB_00139d2c;
          }
          x_00 = (_glist *)ptVar4->nl_string;
          snprintf(local_418,999,"%s/%s/",x_00,dir);
          local_31 = 0;
          sys_bashfilename(local_418,local_808);
          iVar5 = access(local_808,0);
        } while (iVar5 != 0);
LAB_00139c59:
        ptVar4 = namelist_append(p_Var2->ce_path,local_418,0);
        p_Var2->ce_path = ptVar4;
        goto LAB_00139d07;
      }
    }
LAB_00139a8a:
    ptVar4 = p_Var2->ce_path;
    goto LAB_00139a96;
  }
  iVar1 = strcmp(pcVar6,"-stdpath");
  if (iVar1 == 0) {
    iVar5 = sys_isabsolutepath(dir);
    if (iVar5 != 0) goto LAB_00139a8a;
    iVar5 = strncmp("extra/",dir,6);
    pcVar6 = dir + 6;
    if (iVar5 != 0) {
      pcVar6 = dir;
    }
    canvas_completepath(pcVar6,local_418,0,x_00);
    sys_bashfilename(local_418,local_808);
    iVar5 = access(local_808,0);
    if (iVar5 == 0) goto LAB_00139c59;
    ptVar4 = (t_namelist *)&(pd_maininstance.pd_stuff)->st_staticpath;
    do {
      ptVar4 = ptVar4->nl_next;
      if (ptVar4 == (t_namelist *)0x0) goto LAB_00139d07;
      x_00 = (_glist *)ptVar4->nl_string;
      snprintf(local_418,999,"%s/%s/",x_00,pcVar6);
      local_31 = 0;
      sys_bashfilename(local_418,local_808);
      iVar5 = access(local_808,0);
    } while (iVar5 != 0);
    goto LAB_00139d7c;
  }
  iVar1 = strcmp(pcVar6,"-lib");
  if (iVar1 == 0) {
    iVar5 = sys_isabsolutepath(dir);
    canvas = x;
    if (((iVar5 == 0) && (iVar5 = strncmp("./",dir,2), iVar5 != 0)) &&
       (iVar5 = strncmp("../",dir,3), iVar5 != 0)) {
      canvas_completepath(dir,local_808,(int)x,x_00);
      iVar5 = sys_load_lib(x,dir);
      if (iVar5 == 0) {
        ptVar4 = (t_namelist *)&(pd_maininstance.pd_stuff)->st_searchpath;
        do {
          ptVar4 = ptVar4->nl_next;
          if (ptVar4 == (t_namelist *)0x0) break;
          x_00 = (_glist *)ptVar4->nl_string;
          snprintf(local_808,999,"%s/%s",x_00,dir);
          local_421 = 0;
          iVar5 = sys_load_lib(x,local_808);
        } while (iVar5 == 0);
      }
    }
    else {
LAB_00139acf:
      sys_load_lib(canvas,dir);
    }
  }
  else {
    iVar1 = strcmp(pcVar6,"-stdlib");
    if (iVar1 != 0) goto LAB_00139984;
    iVar5 = sys_isabsolutepath(dir);
    if (iVar5 != 0) {
      canvas = (_glist *)0x0;
      goto LAB_00139acf;
    }
    iVar5 = strncmp("extra/",dir,6);
    pcVar6 = dir + 6;
    if (iVar5 != 0) {
      pcVar6 = dir;
    }
    canvas_completepath(pcVar6,local_808,0,x_00);
    iVar5 = sys_load_lib((_glist *)0x0,local_808);
    if (iVar5 == 0) {
      ptVar4 = (t_namelist *)&(pd_maininstance.pd_stuff)->st_staticpath;
      do {
        ptVar4 = ptVar4->nl_next;
        if (ptVar4 == (t_namelist *)0x0) break;
        x_00 = (_glist *)ptVar4->nl_string;
        snprintf(local_808,999,"%s/%s",x_00,pcVar6);
        local_421 = 0;
        iVar5 = sys_load_lib((_glist *)0x0,local_808);
      } while (iVar5 == 0);
    }
  }
  goto LAB_00139d07;
  while( true ) {
    x_00 = (_glist *)ptVar4->nl_string;
    snprintf(local_418,999,"%s/%s/",x_00,dir);
    local_31 = 0;
    sys_bashfilename(local_418,local_808);
    iVar5 = access(local_808,0);
    if (iVar5 == 0) break;
LAB_00139d2c:
    ptVar4 = ptVar4->nl_next;
    if (ptVar4 == (t_namelist *)0x0) goto LAB_00139d07;
  }
LAB_00139d7c:
  dir = local_418;
  ptVar4 = p_Var2->ce_path;
LAB_00139a96:
  ptVar4 = namelist_append(ptVar4,dir,0);
  p_Var2->ce_path = ptVar4;
LAB_00139d07:
  iVar5 = which + 1;
  if (argc <= iVar5) {
    return;
  }
  goto LAB_001398f8;
}

Assistant:

void canvas_declare(t_canvas *x, t_symbol *s, int argc, t_atom *argv)
{
    int i;
    t_canvasenvironment *e = canvas_getenv(x);
#if 0
    startpost("declare:: %s", s->s_name);
    postatom(argc, argv);
    endpost();
#endif
    for (i = 0; i < argc; i++)
    {
        const char *flag = atom_getsymbolarg(i, argc, argv)->s_name;
        const char *item = (argc > i+1)?atom_getsymbolarg(i+1, argc, argv)->s_name:0;
        if ((item) && !strcmp(flag, "-path"))
        {
            canvas_path(x, e, item);
            i++;
        }
        else if ((item) && !strcmp(flag, "-stdpath"))
        {
            canvas_stdpath(e, item);
            i++;
        }
        else if ((item) && !strcmp(flag, "-lib"))
        {
            canvas_lib(x, e, item);
            i++;
        }
        else if ((item) && !strcmp(flag, "-stdlib"))
        {
            canvas_stdlib(e, item);
            i++;
        }
        else post("declare: %s: unknown declaration", flag);
    }
}